

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::DoMiter(ClipperOffset *this,int j,int k,double r)

{
  pointer *ppIVar1;
  pointer pIVar2;
  pointer pDVar3;
  iterator __position;
  ulong uVar4;
  double dVar5;
  double dVar6;
  IntPoint local_10;
  
  dVar5 = this->m_delta / r;
  pIVar2 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar6 = (pDVar3[k].X + pDVar3[j].X) * dVar5 + (double)pIVar2[j].X;
  uVar4 = -(ulong)(dVar6 < 0.0);
  local_10.X = (cInt)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) + dVar6);
  dVar5 = (pDVar3[k].Y + pDVar3[j].Y) * dVar5 + (double)pIVar2[j].Y;
  uVar4 = -(ulong)(dVar5 < 0.0);
  local_10.Y = (cInt)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) + dVar5);
  __position._M_current =
       (this->m_destPoly).
       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,__position,&local_10);
  }
  else {
    (__position._M_current)->X = local_10.X;
    (__position._M_current)->Y = local_10.Y;
    ppIVar1 = &(this->m_destPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return;
}

Assistant:

void ClipperOffset::DoMiter(int j, int k, double r)
{
  double q = m_delta / r;
  m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + (m_normals[k].X + m_normals[j].X) * q),
      Round(m_srcPoly[j].Y + (m_normals[k].Y + m_normals[j].Y) * q)));
}